

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O1

int hostkey_method_ssh_ed25519_init
              (LIBSSH2_SESSION *session,uchar *hostkey_data,size_t hostkey_data_len,void **abstract)

{
  int iVar1;
  int iVar2;
  EVP_PKEY *ctx;
  uchar *key;
  size_t key_len;
  string_buf buf;
  EVP_PKEY *local_58;
  uchar *local_50;
  size_t local_48;
  string_buf local_40;
  
  local_58 = (EVP_PKEY *)0x0;
  if ((EVP_PKEY *)*abstract != (EVP_PKEY *)0x0) {
    EVP_PKEY_free((EVP_PKEY *)*abstract);
    *abstract = (void *)0x0;
  }
  iVar2 = -1;
  if (0x12 < hostkey_data_len) {
    local_40.data = hostkey_data;
    local_40.dataptr = hostkey_data;
    local_40.len = hostkey_data_len;
    iVar1 = _libssh2_match_string(&local_40,"ssh-ed25519");
    if (iVar1 == 0) {
      iVar1 = _libssh2_get_string(&local_40,&local_50,&local_48);
      if (iVar1 == 0) {
        iVar1 = _libssh2_eob(&local_40);
        if (iVar1 != 0) {
          iVar1 = _libssh2_ed25519_new_public(&local_58,session,local_50,local_48);
          if (iVar1 == 0) {
            *abstract = local_58;
            iVar2 = 0;
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int
hostkey_method_ssh_ed25519_init(LIBSSH2_SESSION * session,
                                const unsigned char *hostkey_data,
                                size_t hostkey_data_len,
                                void **abstract)
{
    size_t key_len;
    unsigned char *key;
    libssh2_ed25519_ctx *ctx = NULL;
    struct string_buf buf;

    if(*abstract) {
        hostkey_method_ssh_ed25519_dtor(session, abstract);
        *abstract = NULL;
    }

    if(hostkey_data_len < 19) {
        _libssh2_debug((session, LIBSSH2_TRACE_ERROR,
                       "host key length too short"));
        return -1;
    }

    buf.data = (unsigned char *)hostkey_data;
    buf.dataptr = buf.data;
    buf.len = hostkey_data_len;

    if(_libssh2_match_string(&buf, "ssh-ed25519"))
        return -1;

    /* public key */
    if(_libssh2_get_string(&buf, &key, &key_len))
        return -1;

    if(!_libssh2_eob(&buf))
        return -1;

    if(_libssh2_ed25519_new_public(&ctx, session, key, key_len) != 0) {
        return -1;
    }

    *abstract = ctx;

    return 0;
}